

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

void artrans(int p,double *old,double *new1)

{
  void *__src;
  double *pdVar1;
  long lVar2;
  double *pdVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  
  __src = malloc((long)p * 8);
  if (0 < p) {
    uVar5 = 0;
    do {
      dVar6 = tanh(old[uVar5]);
      new1[uVar5] = dVar6;
      *(double *)((long)__src + uVar5 * 8) = dVar6;
      uVar5 = uVar5 + 1;
    } while ((uint)p != uVar5);
    if (p != 1) {
      lVar4 = 1;
      uVar5 = 0;
      pdVar3 = new1;
      do {
        dVar6 = new1[lVar4];
        lVar2 = 0;
        pdVar1 = pdVar3;
        do {
          *(double *)((long)__src + lVar2 * 8) =
               *pdVar1 * -dVar6 + *(double *)((long)__src + lVar2 * 8);
          lVar2 = lVar2 + 1;
          pdVar1 = pdVar1 + -1;
        } while (lVar4 != lVar2);
        memcpy(new1,__src,uVar5 * 8 + 8);
        lVar4 = lVar4 + 1;
        uVar5 = uVar5 + 1;
        pdVar3 = pdVar3 + 1;
      } while (uVar5 != p - 1);
    }
  }
  free(__src);
  return;
}

Assistant:

void artrans(int p, double *old, double *new1) {
	int j, k;
	double a;
	double *temp;

	temp = (double*)malloc(sizeof(double)* p);

	for (j = 0; j < p; ++j) {
		new1[j] = tanh(old[j]);
		temp[j] = new1[j];
	}

	for (j = 1; j < p; ++j) {
		a = new1[j];
		for (k = 0; k < j; ++k) {
			temp[k] -= a * new1[j - k - 1];
		}
		for (k = 0; k < j; ++k) {
			new1[k] = temp[k];
		}
	}

	free(temp);
}